

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O0

int __thiscall CTPNStmProg::gen_code_for_build(CTPNStmProg *this)

{
  CTcCodeStream *pCVar1;
  int iVar2;
  CTcPrsSymtab *pCVar3;
  undefined8 *in_RDI;
  uint local_4;
  
  CTcTokenizer::parsing_done((CTcTokenizer *)0x210f32);
  CTcGenTarg::parsing_done(G_cg);
  pCVar1 = G_cs_main;
  pCVar3 = CTcParser::get_global_symtab(G_prs);
  CTcCodeStream::set_symtab(pCVar1,pCVar3);
  pCVar1 = G_cs_static;
  pCVar3 = CTcParser::get_global_symtab(G_prs);
  CTcCodeStream::set_symtab(pCVar1,pCVar3);
  (**(code **)*in_RDI)(in_RDI,1);
  iVar2 = CTcMain::get_error_count(G_tcmain);
  local_4 = (uint)(iVar2 != 0);
  return local_4;
}

Assistant:

int CTPNStmProg::gen_code_for_build()
{
    /* notify the tokenizer that parsing is done */
    G_tok->parsing_done();

    /* notify the code generator that we're finished parsing */
    G_cg->parsing_done();

    /* set the global symbol table in the code streams */
    G_cs_main->set_symtab(G_prs->get_global_symtab());
    G_cs_static->set_symtab(G_prs->get_global_symtab());

    /* generate code for the entire program */
    gen_code(TRUE, TRUE);

    /* 
     *   if we encountered any errors generating code, don't bother
     *   writing the image 
     */
    if (G_tcmain->get_error_count() != 0)
        return 1;

    /* return success */
    return 0;
}